

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

int8_t mpack_node_exttype(mpack_node_t node)

{
  mpack_tree_t *tree;
  
  tree = node.tree;
  if (tree->error != mpack_ok) {
    return '\0';
  }
  if ((node.data)->type == mpack_type_ext) {
    return (tree->data + -1)[(long)((node.data)->value).children];
  }
  mpack_tree_flag_error(tree,mpack_error_type);
  return '\0';
}

Assistant:

MPACK_INLINE int8_t mpack_node_exttype(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_ext)
        return mpack_node_exttype_unchecked(node);

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}